

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void turn(int x,int y)

{
  Position PVar1;
  int local_18;
  uint uStack_14;
  Position pos;
  int y_local;
  int x_local;
  
  board[x][y] = 2;
  PVar1 = aiTurn((char (*) [15])board,1,x,y);
  local_18 = PVar1.x;
  uStack_14 = PVar1.y;
  board[local_18][(int)uStack_14] = 1;
  printf("%d %d\n",(ulong)PVar1 & 0xffffffff,(ulong)uStack_14);
  fflush(_stdout);
  return;
}

Assistant:

void turn(int x, int y) {
    board[x][y] = OTHER;

    // AI
    struct Position pos = aiTurn((const char (*)[BOARD_SIZE]) board, ME, x, y);
    board[pos.x][pos.y] = ME;
    printf("%d %d\n", pos.x, pos.y);
    fflush(stdout);
}